

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node_leaf(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  byte *pbVar1;
  lysp_node *plVar2;
  ushort uVar3;
  LY_ERR LVar4;
  long *plVar5;
  lysp_ext_instance *plVar6;
  long lVar7;
  lysp_restr *must_p;
  long lVar8;
  long lVar9;
  lysp_ext_instance *plVar10;
  
  plVar2 = pnode[1].parent;
  if (plVar2 != (lysp_node *)0x0) {
    lVar7 = *(long *)(node + 1);
    if (lVar7 == 0) {
      plVar5 = (long *)calloc(1,(long)plVar2[-1].exts * 0x38 + 8);
      if (plVar5 == (long *)0x0) goto LAB_0014a1b0;
      lVar7 = 0;
      lVar8 = 0;
    }
    else {
      lVar8 = *(long *)(lVar7 + -8);
      plVar5 = (long *)realloc((void *)(lVar7 + -8),
                               ((long)&(plVar2[-1].exts)->name + lVar8 * 2) * 0x38 + 8);
      if (plVar5 == (long *)0x0) {
LAB_0014a1b0:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_leaf")
        ;
        return LY_EMEM;
      }
      lVar7 = *plVar5;
    }
    *(long **)(node + 1) = plVar5 + 1;
    if (pnode[1].parent == (lysp_node *)0x0) {
      plVar10 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar10 = pnode[1].parent[-1].exts;
    }
    lVar9 = 0;
    memset(plVar5 + lVar7 * 7 + 1,0,((long)&plVar10->name + lVar8) * 0x38);
    plVar10 = (lysp_ext_instance *)0xffffffffffffffff;
    while( true ) {
      plVar2 = pnode[1].parent;
      if (plVar2 == (lysp_node *)0x0) {
        plVar6 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar6 = plVar2[-1].exts;
      }
      plVar10 = (lysp_ext_instance *)((long)&plVar10->name + 1);
      if (plVar6 <= plVar10) break;
      lVar7 = *(long *)(node + 1);
      lVar8 = *(long *)(lVar7 + -8);
      *(long *)(lVar7 + -8) = lVar8 + 1;
      must_p = (lysp_restr *)((long)&plVar2->parent + lVar9);
      lVar9 = lVar9 + 0x40;
      LVar4 = lys_compile_must(ctx,must_p,(lysc_must *)(lVar8 * 0x38 + lVar7));
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
    }
  }
  LVar4 = lysc_unres_must_add(ctx,node,pnode);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (pnode[2].exts != (lysp_ext_instance *)0x0) {
    LVar4 = lydict_insert(ctx->ctx,(char *)pnode[2].exts,0,(char **)&node[1].next);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    pbVar1 = (byte *)((long)&node->flags + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  LVar4 = lys_compile_node_type(ctx,pnode,(lysp_type *)&pnode[1].next,(lysc_node_leaf *)node);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (pnode[3].parent == (lysp_node *)0x0) {
    uVar3 = node->flags;
  }
  else {
    LVar4 = lysc_unres_leaf_dflt_add(ctx,(lysc_node_leaf *)node,(lysp_qname *)(pnode + 3));
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    uVar3 = node->flags | 0x200;
    node->flags = uVar3;
  }
  if ((~uVar3 & 0x220) != 0) {
    return LY_SUCCESS;
  }
  ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid mandatory leaf with a default value.");
  return LY_EVALID;
}

Assistant:

static LY_ERR
lys_compile_node_leaf(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_leaf *leaf_p = (struct lysp_node_leaf *)pnode;
    struct lysc_node_leaf *leaf = (struct lysc_node_leaf *)node;
    LY_ERR ret = LY_SUCCESS;

    COMPILE_ARRAY_GOTO(ctx, leaf_p->musts, leaf->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    if (leaf_p->units) {
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, leaf_p->units, 0, &leaf->units), done);
        leaf->flags |= LYS_SET_UNITS;
    }

    /* compile type */
    ret = lys_compile_node_type(ctx, pnode, &leaf_p->type, leaf);
    LY_CHECK_GOTO(ret, done);

    /* store/update default value */
    if (leaf_p->dflt.str) {
        LY_CHECK_RET(lysc_unres_leaf_dflt_add(ctx, leaf, &leaf_p->dflt));
        leaf->flags |= LYS_SET_DFLT;
    }

    /* checks */
    if ((leaf->flags & LYS_SET_DFLT) && (leaf->flags & LYS_MAND_TRUE)) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Invalid mandatory leaf with a default value.");
        return LY_EVALID;
    }

done:
    return ret;
}